

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void G_UnSnapshotLevel(bool hubLoad)

{
  PClass *pPVar1;
  bool bVar2;
  DThinker *pDVar3;
  DThinker *pDVar4;
  long *plVar5;
  int i;
  long lVar6;
  DThinker *pDVar7;
  TThinkerIterator<APlayerPawn> it;
  FArchive arc;
  FThinkerIterator local_310;
  FArchive local_2f8;
  
  if ((level.info)->snapshot != (FCompressedMemFile *)0x0) {
    bVar2 = level_info_t::isValid(level.info);
    if (bVar2) {
      SaveVersion = (level.info)->snapshotVer;
      FCompressedMemFile::Reopen((level.info)->snapshot);
      FArchive::FArchive(&local_2f8,(FFile *)(level.info)->snapshot);
      if (hubLoad) {
        local_2f8.m_HubTravel = true;
      }
      G_SerializeLevel(&local_2f8,hubLoad);
      FArchive::Close(&local_2f8);
      level.FromSnapshot = true;
      FThinkerIterator::FThinkerIterator(&local_310,APlayerPawn::RegistrationInfo.MyClass,0x80);
      pDVar3 = FThinkerIterator::Next(&local_310);
      if (pDVar3 != (DThinker *)0x0) {
        do {
          pDVar4 = FThinkerIterator::Next(&local_310);
          pPVar1 = pDVar3[9].super_DObject.Class;
          if (((pPVar1 == (PClass *)0x0) ||
              ((pPVar1->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
               super_DObject._vptr_DObject == (_func_int **)0x0)) ||
             (playeringame
              [((long)&pPVar1[-0xbdba].super_PStruct.super_PNamedType.super_PCompoundType.
                       super_PType.HashNext >> 5) * -0x30c30c30c30c30c3] == false)) {
            plVar5 = &players;
            lVar6 = 0;
            do {
              if ((playeringame[lVar6] == true) && ((int)plVar5[0x28] != 0)) {
                pDVar7 = *(DThinker **)(*plVar5 + 0x248);
                if (pDVar7 == (DThinker *)0x0) {
LAB_004e0967:
                  pDVar7 = (DThinker *)0x0;
                }
                else if (((pDVar7->super_DObject).ObjectFlags & 0x20) != 0) {
                  *(undefined8 *)(*plVar5 + 0x248) = 0;
                  goto LAB_004e0967;
                }
                if (pDVar7 == pDVar3) goto LAB_004e0986;
              }
              lVar6 = lVar6 + 1;
              plVar5 = plVar5 + 0x54;
            } while (lVar6 != 8);
            (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
          }
LAB_004e0986:
          pDVar3 = pDVar4;
        } while (pDVar4 != (DThinker *)0x0);
      }
      FArchive::~FArchive(&local_2f8);
    }
    level_info_t::ClearSnapshot(level.info);
    if (hubLoad) {
      FBehavior::StaticUnlockLevelVarStrings();
    }
  }
  return;
}

Assistant:

void G_UnSnapshotLevel (bool hubLoad)
{
	if (level.info->snapshot == NULL)
		return;

	if (level.info->isValid())
	{
		SaveVersion = level.info->snapshotVer;
		level.info->snapshot->Reopen ();
		FArchive arc (*level.info->snapshot);
		if (hubLoad)
			arc.SetHubTravel ();
		G_SerializeLevel (arc, hubLoad);
		arc.Close ();
		level.FromSnapshot = true;

		TThinkerIterator<APlayerPawn> it;
		APlayerPawn *pawn, *next;

		next = it.Next();
		while ((pawn = next) != 0)
		{
			next = it.Next();
			if (pawn->player == NULL || pawn->player->mo == NULL || !playeringame[pawn->player - players])
			{
				int i;

				// If this isn't the unmorphed original copy of a player, destroy it, because it's extra.
				for (i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i] && players[i].morphTics && players[i].mo->tracer == pawn)
					{
						break;
					}
				}
				if (i == MAXPLAYERS)
				{
					pawn->Destroy ();
				}
			}
		}
	}
	// No reason to keep the snapshot around once the level's been entered.
	level.info->ClearSnapshot();
	if (hubLoad)
	{
		// Unlock ACS global strings that were locked when the snapshot was made.
		FBehavior::StaticUnlockLevelVarStrings();
	}
}